

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpCodeUtil.cpp
# Opt level: O0

void Js::OpCodeUtil::ConvertOpToNonProfiled(OpCode *op)

{
  bool bVar1;
  OpCode OVar2;
  OpCode *op_local;
  
  bVar1 = IsProfiledCallOp(*op);
  if ((bVar1) || (bVar1 = IsProfiledCallOpWithICIndex(*op), bVar1)) {
    OVar2 = ConvertProfiledCallOpToNonProfiled(*op);
    *op = OVar2;
  }
  else {
    bVar1 = IsProfiledReturnTypeCallOp(*op);
    if (bVar1) {
      OVar2 = ConvertProfiledReturnTypeCallOpToNonProfiled(*op);
      *op = OVar2;
    }
    else {
      ConvertNonCallOpToNonProfiled(op);
    }
  }
  return;
}

Assistant:

void OpCodeUtil::ConvertOpToNonProfiled(OpCode& op)
    {
        if (IsProfiledCallOp(op) || IsProfiledCallOpWithICIndex(op))
        {
            op = ConvertProfiledCallOpToNonProfiled(op);
        }
        else if (IsProfiledReturnTypeCallOp(op))
        {
            op = ConvertProfiledReturnTypeCallOpToNonProfiled(op);
        }
        else
        {
            ConvertNonCallOpToNonProfiled(op);
        }
    }